

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PingPongServer.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  element_type *peVar2;
  element_type *peVar3;
  ostream *poVar4;
  __int_type _Var5;
  long lVar6;
  EventLoop local_190 [8];
  EventLoop mainLoop;
  function<void_(const_std::shared_ptr<brynet::net::EventLoop>_&)> local_c0;
  anon_class_16_1_6b262081 local_a0;
  function<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>)>
  local_90;
  allocator<char> local_69;
  string local_68 [48];
  __shared_ptr_access<brynet::net::ListenThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  local_38 [8];
  PTR listenThread;
  shared_ptr<brynet::net::WrapTcpService> server;
  char **argv_local;
  int argc_local;
  
  if (argc != 3) {
    fprintf(_stderr,"Usage: <listen port> <net work thread num>\n");
    exit(-1);
  }
  std::make_shared<brynet::net::WrapTcpService>();
  brynet::net::ListenThread::Create();
  peVar2 = std::
           __shared_ptr_access<brynet::net::ListenThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,"0.0.0.0",&local_69);
  iVar1 = atoi(argv[1]);
  std::shared_ptr<brynet::net::WrapTcpService>::shared_ptr
            (&local_a0.server,
             (shared_ptr<brynet::net::WrapTcpService> *)
             &listenThread.super___shared_ptr<brynet::net::ListenThread,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::
  function<void(std::unique_ptr<brynet::net::TcpSocket,brynet::net::TcpSocket::TcpSocketDeleter>)>::
  function<main::__0,void>
            ((function<void(std::unique_ptr<brynet::net::TcpSocket,brynet::net::TcpSocket::TcpSocketDeleter>)>
              *)&local_90,&local_a0);
  brynet::net::ListenThread::startListen(peVar2,0,local_68,iVar1,&local_90);
  std::
  function<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>)>
  ::~function(&local_90);
  main::$_0::~__0((__0 *)&local_a0);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  peVar3 = std::
           __shared_ptr_access<brynet::net::WrapTcpService,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<brynet::net::WrapTcpService,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&listenThread.
                            super___shared_ptr<brynet::net::ListenThread,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
  iVar1 = atoi(argv[2]);
  std::function<void_(const_std::shared_ptr<brynet::net::EventLoop>_&)>::function
            (&local_c0,(nullptr_t)0x0);
  brynet::net::WrapTcpService::startWorkThread(peVar3,(long)iVar1,&local_c0);
  std::function<void_(const_std::shared_ptr<brynet::net::EventLoop>_&)>::~function(&local_c0);
  brynet::net::EventLoop::EventLoop(local_190);
  do {
    brynet::net::EventLoop::loop((long)local_190);
    poVar4 = std::operator<<((ostream *)&std::cout,"total recv : ");
    _Var5 = std::__atomic_base::operator_cast_to_long_long((__atomic_base *)&TotalRecvSize);
    if (_Var5 < 0) {
      _Var5 = _Var5 + 0x3ff;
    }
    lVar6 = _Var5 >> 10;
    if (lVar6 < 0) {
      lVar6 = lVar6 + 0x3ff;
    }
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,lVar6 >> 10);
    poVar4 = std::operator<<(poVar4," M /s, of client num:");
    _Var5 = std::__atomic_base::operator_cast_to_long_long((__atomic_base *)&total_client_num);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,_Var5);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"packet num:");
    _Var5 = std::__atomic_base::operator_cast_to_long_long((__atomic_base *)&total_packet_num);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,_Var5);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__atomic_base<long_long>::operator=(&total_packet_num.super___atomic_base<long_long>,0);
    std::__atomic_base<long_long>::operator=(&TotalRecvSize.super___atomic_base<long_long>,0);
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
    if (argc != 3)
    {
        fprintf(stderr, "Usage: <listen port> <net work thread num>\n");
        exit(-1);
    }

    auto server = std::make_shared<WrapTcpService>();
    auto listenThread = ListenThread::Create();

    listenThread->startListen(false, "0.0.0.0", atoi(argv[1]), [=](TcpSocket::PTR socket){
        socket->SocketNodelay();

        auto enterCallback = [](const TCPSession::PTR& session) {
            total_client_num++;

            session->setDataCallback([](const TCPSession::PTR& session, const char* buffer, size_t len) {
                session->send(buffer, len);
                TotalRecvSize += len;
                total_packet_num++;
                return len;
            });

            session->setDisConnectCallback([](const TCPSession::PTR& session) {
                total_client_num--;
            });
        };

        server->addSession(std::move(socket),
                AddSessionOption::WithEnterCallback(enterCallback),
                AddSessionOption::WithMaxRecvBufferSize(1024*1024));
    });

    server->startWorkThread(atoi(argv[2]));

    EventLoop mainLoop;
    while (true)
    {
        mainLoop.loop(1000);
        std::cout << "total recv : " << (TotalRecvSize / 1024) / 1024 << " M /s, of client num:" << total_client_num << std::endl;
        std::cout << "packet num:" << total_packet_num << std::endl;
        total_packet_num = 0;
        TotalRecvSize = 0;
    }
}